

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O0

vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> * __thiscall
llbuild::basic::StringList::getValues
          (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__return_storage_ptr__,
          StringList *this)

{
  char *local_80;
  undefined1 local_58 [8];
  StringRef value;
  uint64_t i;
  StringList *this_local;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *result;
  
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector(__return_storage_ptr__);
  value.Length = 0;
  while( true ) {
    if (this->size <= value.Length) {
      return __return_storage_ptr__;
    }
    local_58 = (undefined1  [8])(this->contents + value.Length);
    if (local_58 == (undefined1  [8])0x0) {
      local_80 = (char *)0x0;
    }
    else {
      local_80 = (char *)strlen((char *)local_58);
    }
    value.Data = local_80;
    if ((char *)this->size < local_80 + value.Length) break;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (__return_storage_ptr__,(value_type *)local_58);
    value.Length = (size_t)(value.Data + value.Length + 1);
  }
  __assert_fail("i + value.size() <= size",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                ,0x5d,"std::vector<StringRef> llbuild::basic::StringList::getValues() const");
}

Assistant:

std::vector<StringRef> getValues() const {
    std::vector<StringRef> result;
    for (uint64_t i = 0; i < size;) {
      auto value = StringRef(&contents[i]);
      assert(i + value.size() <= size);
      result.push_back(value);
      i += value.size() + 1;
    }
    return result;
  }